

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs8.cc
# Opt level: O0

pbe_suite * get_pkcs12_pbe_suite(int pbe_nid)

{
  uint local_18;
  uint i;
  int pbe_nid_local;
  
  local_18 = 0;
  while( true ) {
    if (3 < local_18) {
      return (pbe_suite *)0x0;
    }
    if (((kBuiltinPBE[local_18].pbe_nid == pbe_nid) &&
        (kBuiltinPBE[local_18].cipher_func != (_func_EVP_CIPHER_ptr *)0x0)) &&
       (kBuiltinPBE[local_18].md_func != (_func_EVP_MD_ptr *)0x0)) break;
    local_18 = local_18 + 1;
  }
  return kBuiltinPBE + local_18;
}

Assistant:

static const struct pbe_suite *get_pkcs12_pbe_suite(int pbe_nid) {
  for (unsigned i = 0; i < OPENSSL_ARRAY_SIZE(kBuiltinPBE); i++) {
    if (kBuiltinPBE[i].pbe_nid == pbe_nid &&
        // If |cipher_func| or |md_func| are missing, this is a PBES2 scheme.
        kBuiltinPBE[i].cipher_func != NULL && kBuiltinPBE[i].md_func != NULL) {
      return &kBuiltinPBE[i];
    }
  }

  return NULL;
}